

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O2

PtexCachedReader * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::get
          (PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*> *this,StringKey *key)

{
  uint32_t uVar1;
  bool bVar2;
  Entry *pEVar3;
  uint uVar4;
  uint32_t i;
  uint32_t uVar5;
  
  uVar1 = this->_numEntries;
  pEVar3 = getEntries(this);
  uVar5 = key->_hash;
  do {
    uVar4 = uVar5 & uVar1 - 1;
    bVar2 = StringKey::matches(&pEVar3[uVar4].key,key);
    if (bVar2) {
      return pEVar3[uVar4].value;
    }
    uVar5 = uVar5 + 1;
  } while (pEVar3[uVar4].value != (PtexCachedReader *)0x0);
  return (PtexCachedReader *)0x0;
}

Assistant:

Value get(Key& key)
    {
        uint32_t mask = _numEntries-1;
        Entry* entries = getEntries();
        uint32_t hash = key.hash();

        Value result = 0;
        for (uint32_t i = hash;; ++i) {
            Entry& e = entries[i & mask];
            if (e.key.matches(key)) {
                result = e.value;
                break;
            }
            if (e.value == 0) {
                break;
            }
        }

        return result;
    }